

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

class_<Pet> * __thiscall
pybind11::class_<Pet>::def<std::__cxx11::string_const&(Pet::*)()const>
          (class_<Pet> *this,char *name_,offset_in_Pet_to_subr *f)

{
  offset_in_Pet_to_subr f_00;
  name *extra;
  handle local_b0;
  PyObject *local_a8;
  obj_attr_accessor local_a0;
  offset_in_Pet_to_subr local_80;
  name *local_78;
  handle local_60;
  PyObject *local_58;
  handle local_50;
  handle local_48;
  sibling local_40;
  is_method local_38;
  is_method local_30;
  cpp_function local_28;
  cpp_function cf;
  offset_in_Pet_to_subr *f_local;
  char *name__local;
  class_<Pet> *this_local;
  
  f_00 = *f;
  extra = (name *)f[1];
  cf.super_function.super_object.super_handle.m_ptr = (function)(function)f;
  pybind11::name::name((name *)&local_30,name_);
  is_method::is_method(&local_38,(handle *)this);
  local_50.m_ptr = (this->super_generic_type).super_object.super_handle.m_ptr;
  none::none((none *)&local_60);
  local_58 = local_60.m_ptr;
  getattr((pybind11 *)&local_48,local_50,name_,local_60);
  sibling::sibling(&local_40,&local_48);
  local_80 = f_00;
  local_78 = extra;
  cpp_function::
  cpp_function<std::__cxx11::string_const&,Pet,,pybind11::name,pybind11::is_method,pybind11::sibling>
            (&local_28,f_00,extra,&local_30,(sibling *)&local_38);
  object::~object((object *)&local_48);
  none::~none((none *)&local_60);
  cpp_function::name((cpp_function *)&local_b0);
  local_a8 = local_b0.m_ptr;
  detail::object_api<pybind11::handle>::attr
            (&local_a0,(object_api<pybind11::handle> *)this,local_b0);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=(&local_a0,&local_28);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor(&local_a0);
  object::~object((object *)&local_b0);
  cpp_function::~cpp_function(&local_28);
  return this;
}

Assistant:

class_ &def(const char *name_, Func&& f, const Extra&... extra) {
        cpp_function cf(std::forward<Func>(f), name(name_), is_method(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = cf;
        return *this;
    }